

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O2

void __thiscall
isotree::IsolationForest::fit
          (IsolationForest *this,double *numeric_data,size_t ncols_numeric,size_t nrows,
          int *categ_data,size_t ncols_categ,int *ncat,double *sample_weights,double *col_weights)

{
  Imputer *model_outputs;
  int iVar1;
  Imputer *imputer;
  runtime_error *this_00;
  Imputer *pIVar2;
  Imputer *model_outputs_ext;
  allocator<char> local_1a8;
  allocator<char> local_1a7;
  allocator<char> local_1a6;
  allocator<char> local_1a5;
  uint local_1a4;
  ScoringMetric local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  CoefType local_184;
  size_t local_180;
  size_t local_178;
  int *local_170;
  double *local_168;
  size_t local_160;
  size_t local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_178 = nrows;
  local_170 = categ_data;
  local_168 = numeric_data;
  local_160 = ncols_categ;
  local_158 = ncols_numeric;
  check_params(this);
  override_previous_fit(this);
  model_outputs_ext = (Imputer *)&this->model_ext;
  pIVar2 = (Imputer *)0x0;
  model_outputs = pIVar2;
  if (this->ndim == 1) {
    model_outputs_ext = pIVar2;
    model_outputs = (Imputer *)&this->model;
  }
  local_180 = this->ntry;
  local_184 = this->coef_type;
  local_188 = (uint)this->coef_by_prop;
  local_18c = (uint)this->with_replacement;
  local_190 = (uint)this->weight_as_sample;
  local_194 = (uint)this->limit_depth;
  local_198 = (uint)this->penalize_range;
  local_19c = (uint)this->standardize_data;
  local_1a0 = this->scoring_metric;
  local_1a4 = (uint)this->fast_bratio;
  imputer = &this->imputer;
  if (this->build_imputer == false) {
    imputer = pIVar2;
  }
  iVar1 = fit_iforest((IsoForest *)model_outputs,(ExtIsoForest *)model_outputs_ext,local_168,
                      local_158,local_170,local_160,ncat,(double *)0x0,(int *)0x0,(int *)0x0,
                      this->ndim,local_180,local_184,this->coef_by_prop,sample_weights,
                      this->with_replacement,this->weight_as_sample,local_178,this->sample_size,
                      this->ntrees,this->max_depth,this->ncols_per_tree,this->limit_depth,
                      this->penalize_range,this->standardize_data,local_1a0,this->fast_bratio,false,
                      (double *)0x0,(double *)0x0,true,col_weights,this->weigh_by_kurt,
                      this->prob_pick_by_gain_pl,this->prob_pick_by_gain_avg,
                      this->prob_pick_by_full_gain,this->prob_pick_by_dens,
                      this->prob_pick_col_by_range,this->prob_pick_col_by_var,
                      this->prob_pick_col_by_kurt,this->min_gain,this->missing_action,
                      this->cat_split_type,this->new_cat_action,this->all_perm,imputer,
                      this->min_imp_obs,this->depth_imp,this->weigh_imp_rows,false,this->random_seed
                      ,false,this->nthreads);
  if (iVar1 == 0) {
    this->is_fitted = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Unexpected error in ",&local_1a5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/oop_interface.cpp"
             ,&local_1a6);
  std::operator+(&local_b0,&local_d0,&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,":",&local_1a7);
  std::operator+(&local_90,&local_b0,&local_110);
  std::__cxx11::to_string(&local_130,0xc4);
  std::operator+(&local_70,&local_90,&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
             ,&local_1a8);
  std::operator+(&local_50,&local_70,&local_150);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IsolationForest::fit(double numeric_data[],   size_t ncols_numeric,  size_t nrows,
                          int    categ_data[],     size_t ncols_categ,    int ncat[],
                          double sample_weights[], double col_weights[])
{
    this->check_params();
    this->override_previous_fit();

    auto retcode = fit_iforest(
        (this->ndim == 1)? &this->model : nullptr,
        (this->ndim != 1)? &this->model_ext : nullptr,
        numeric_data,  ncols_numeric,
        categ_data, ncols_categ, ncat,
        (double*)nullptr, (int*)nullptr, (int*)nullptr,
        this->ndim, this->ntry, this->coef_type, this->coef_by_prop,
        sample_weights, this->with_replacement, this->weight_as_sample,
        nrows, this->sample_size, this->ntrees,
        this->max_depth, this->ncols_per_tree,
        this->limit_depth, this->penalize_range, this->standardize_data,
        this->scoring_metric, this->fast_bratio,
        false, (double*)nullptr,
        (double*)nullptr, true,
        col_weights, this->weigh_by_kurt,
        this->prob_pick_by_gain_pl,
        this->prob_pick_by_gain_avg,
        this->prob_pick_by_full_gain,
        this->prob_pick_by_dens,
        this->prob_pick_col_by_range,
        this->prob_pick_col_by_var,
        this->prob_pick_col_by_kurt,
        this->min_gain, this->missing_action,
        this->cat_split_type, this->new_cat_action,
        this->all_perm, this->build_imputer? &this->imputer : nullptr, this->min_imp_obs,
        this->depth_imp, this->weigh_imp_rows, false,
        this->random_seed, false, this->nthreads
    );
    if (retcode != EXIT_SUCCESS) unexpected_error();
    this->is_fitted = true;
}